

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O3

ostream * operator<<(ostream *os,substring *ss)

{
  ostream *poVar1;
  string s;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,ss->begin,ss->end);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const substring& ss)
{
  std::string s(ss.begin, ss.end - ss.begin);
  return os << s;
}